

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

void __thiscall CScript::AppendDataSize(CScript *this,uint32_t size)

{
  long lVar1;
  iterator iVar2;
  iterator last;
  uint in_ESI;
  long in_FS_OFFSET;
  value_type_conflict3 data_1 [4];
  value_type_conflict3 data [2];
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  uint16_t in_stack_ffffffffffffff5e;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff60;
  uchar *in_stack_ffffffffffffff98;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffa0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  iterator in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 0x4c) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff60);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff98);
  }
  else if (in_ESI < 0x100) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff60);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff98);
    iVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff60);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (in_stack_ffffffffffffffa0,iVar2,in_stack_ffffffffffffff98);
  }
  else if (in_ESI < 0x10000) {
    iVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff60);
    last = prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                     (iVar2.ptr,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff98);
    ::WriteLE16((uchar *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff60);
    std::cbegin<unsigned_char[2]>
              ((uchar (*) [2])
               CONCAT26(in_stack_ffffffffffffff5e,
                        CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)));
    std::cend<unsigned_char[2]>
              ((uchar (*) [2])
               CONCAT26(in_stack_ffffffffffffff5e,
                        CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert<const_unsigned_char_*>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8,iVar2.ptr,last.ptr);
  }
  else {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff60);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff98);
    ::WriteLE32((uchar *)in_stack_ffffffffffffff60,
                CONCAT22(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff60);
    std::cbegin<unsigned_char[4]>
              ((uchar (*) [4])
               CONCAT26(in_stack_ffffffffffffff5e,
                        CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)));
    std::cend<unsigned_char[4]>
              ((uchar (*) [4])
               CONCAT26(in_stack_ffffffffffffff5e,
                        CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert<const_unsigned_char_*>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8,
               (uchar *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void AppendDataSize(const uint32_t size)
    {
        if (size < OP_PUSHDATA1) {
            insert(end(), static_cast<value_type>(size));
        } else if (size <= 0xff) {
            insert(end(), OP_PUSHDATA1);
            insert(end(), static_cast<value_type>(size));
        } else if (size <= 0xffff) {
            insert(end(), OP_PUSHDATA2);
            value_type data[2];
            WriteLE16(data, size);
            insert(end(), std::cbegin(data), std::cend(data));
        } else {
            insert(end(), OP_PUSHDATA4);
            value_type data[4];
            WriteLE32(data, size);
            insert(end(), std::cbegin(data), std::cend(data));
        }
    }